

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::Canceler::AdapterBase::~AdapterBase(AdapterBase *this)

{
  Maybe<kj::Canceler::AdapterBase_&> *pMVar1;
  AdapterBase *pAVar2;
  Maybe<kj::Canceler::AdapterBase_&> *p;
  AdapterBase *n;
  
  this->_vptr_AdapterBase = (_func_int **)&PTR___cxa_pure_virtual_0038acc0;
  pMVar1 = (this->prev).ptr;
  if (pMVar1 != (Maybe<kj::Canceler::AdapterBase_&> *)0x0) {
    pMVar1->ptr = (this->next).ptr;
  }
  pAVar2 = (this->next).ptr;
  if (pAVar2 != (AdapterBase *)0x0) {
    (pAVar2->prev).ptr = pMVar1;
  }
  (this->prev).ptr = (Maybe<kj::Canceler::AdapterBase_&> *)0x0;
  (this->next).ptr = (AdapterBase *)0x0;
  return;
}

Assistant:

Canceler::AdapterBase::~AdapterBase() noexcept(false) {
  unlink();
}